

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O3

size_t axl::err::pushFormatStringError_va(char *formatString,axl_va_list *va)

{
  size_t sVar1;
  Error error;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_48;
  axl_va_list local_28;
  
  local_48.m_p = (ErrorHdr *)0x0;
  local_48.m_hdr = (BufHdr *)0x0;
  local_48.m_size = 0;
  local_28._0_8_ = *(undefined8 *)va;
  local_28._8_8_ = *(undefined8 *)&va->field_0x8;
  local_28._16_8_ = *(undefined8 *)&va->field_0x10;
  local_28.m_isInitialized = true;
  sVar1 = Error::formatStringError_va((Error *)&local_48,formatString,&local_28);
  if (local_28.m_isInitialized == true) {
    local_28.m_isInitialized = false;
  }
  if (sVar1 == 0xffffffffffffffff) {
    sVar1 = 0xffffffffffffffff;
  }
  else {
    sVar1 = pushError((ErrorRef *)&local_48);
  }
  rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_48);
  return sVar1;
}

Assistant:

size_t
pushFormatStringError_va(
	const char* formatString,
	axl_va_list va
) {
	Error error;
	size_t result = error.formatStringError_va(formatString, va);
	return result != -1 ? pushError(error) : -1;
}